

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void bcd_add_mag(ppc_avr_t *t,ppc_avr_t *a,ppc_avr_t *b,int *invalid,int *overflow)

{
  int i;
  uint uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  
  bVar5 = false;
  uVar1 = 1;
  do {
    uVar3 = uVar1 >> 1;
    bVar2 = a->u8[uVar3] >> 4;
    if ((uVar1 & 1) == 0) {
      bVar2 = a->u8[uVar3] & 0xf;
    }
    if (9 < bVar2) {
      *invalid = 1;
    }
    bVar4 = b->u8[uVar3] >> 4;
    if ((uVar1 & 1) == 0) {
      bVar4 = b->u8[uVar3] & 0xf;
    }
    if (9 < bVar4) {
      *invalid = 1;
    }
    bVar4 = bVar2 + bVar5 + bVar4;
    bVar5 = 9 < bVar4;
    bVar2 = bVar4 - 10;
    if (!bVar5) {
      bVar2 = bVar4;
    }
    if ((uVar1 & 1) == 0) {
      bVar2 = t->u8[uVar3] & 0xf0 | bVar2;
    }
    else {
      bVar2 = bVar2 << 4 | t->u8[uVar3] & 0xf;
    }
    t->u8[uVar3] = bVar2;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x20);
  *overflow = (uint)bVar5;
  return;
}

Assistant:

static void bcd_add_mag(ppc_avr_t *t, ppc_avr_t *a, ppc_avr_t *b, int *invalid,
                       int *overflow)
{
    int carry = 0;
    int i;
    for (i = 1; i <= 31; i++) {
        uint8_t digit = bcd_get_digit(a, i, invalid) +
                        bcd_get_digit(b, i, invalid) + carry;
        if (digit > 9) {
            carry = 1;
            digit -= 10;
        } else {
            carry = 0;
        }

        bcd_put_digit(t, digit, i);
    }

    *overflow = carry;
}